

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void r4k_helper_tlbwi_mips64el(CPUMIPSState_conflict5 *env)

{
  ulong *puVar1;
  uint idx_00;
  bool bVar2;
  uint local_4c;
  uint local_48;
  int idx;
  r4k_tlb_t_conflict *tlb;
  _Bool RI1;
  _Bool RI0;
  _Bool XI1;
  _Bool XI0;
  _Bool D1;
  _Bool V1;
  _Bool D0;
  _Bool V0;
  _Bool G;
  _Bool EHINV;
  uint32_t tlb_mmid;
  uint32_t MMID;
  uint16_t ASID;
  target_ulong VPN;
  _Bool mi;
  CPUMIPSState_conflict5 *env_local;
  
  bVar2 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  local_48 = env->CP0_MemoryMapID;
  if (bVar2) {
    local_48 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  idx_00 = (env->CP0_Index & 0x7fffffffU) % env->tlb->nb_tlb;
  puVar1 = (ulong *)((long)&env->tlb->mmu + (long)(int)idx_00 * 0x28);
  if (bVar2) {
    local_4c = (uint)*(ushort *)((long)puVar1 + 0xc);
  }
  else {
    local_4c = (uint)puVar1[2];
  }
  if ((((((((*puVar1 != (env->SEGMask & env->CP0_EntryHi & 0xffffffffffffe000)) ||
           (local_4c != local_48)) ||
          ((*(ushort *)((long)puVar1 + 0x14) & 1) !=
           (ushort)((env->CP0_EntryLo0 & env->CP0_EntryLo1 & 1) != 0))) ||
         ((-1 < *(short *)((long)puVar1 + 0x14) && ((env->CP0_EntryHi & 0x400) != 0)))) ||
        (((*(ushort *)((long)puVar1 + 0x14) >> 7 & 1) != 0 && ((env->CP0_EntryLo0 & 2) == 0)))) ||
       (((*(ushort *)((long)puVar1 + 0x14) >> 9 & 1) != 0 && ((env->CP0_EntryLo0 & 4) == 0)))) ||
      (((*(ushort *)((long)puVar1 + 0x14) >> 0xb & 1) == 0 && ((env->CP0_EntryLo0 >> 0x3e & 1) != 0)
       ))) || ((((((*(ushort *)((long)puVar1 + 0x14) >> 0xd & 1) == 0 &&
                  ((long)env->CP0_EntryLo0 < 0)) ||
                 (((*(ushort *)((long)puVar1 + 0x14) >> 8 & 1) != 0 &&
                  ((env->CP0_EntryLo1 & 2) == 0)))) ||
                (((*(ushort *)((long)puVar1 + 0x14) >> 10 & 1) != 0 &&
                 ((env->CP0_EntryLo1 & 4) == 0)))) ||
               ((((*(ushort *)((long)puVar1 + 0x14) >> 0xc & 1) == 0 &&
                 ((env->CP0_EntryLo1 >> 0x3e & 1) != 0)) ||
                (((*(ushort *)((long)puVar1 + 0x14) >> 0xe & 1) == 0 &&
                 ((long)env->CP0_EntryLo1 < 0)))))))) {
    r4k_mips_tlb_flush_extra(env,env->tlb->nb_tlb);
  }
  r4k_invalidate_tlb_mips64el(env,idx_00,0);
  r4k_fill_tlb(env,idx_00);
  return;
}

Assistant:

void r4k_helper_tlbwi(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    target_ulong VPN;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    bool EHINV, G, V0, D0, V1, D1, XI0, XI1, RI0, RI1;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;

    idx = (env->CP0_Index & ~0x80000000) % env->tlb->nb_tlb;
    tlb = &env->tlb->mmu.r4k.tlb[idx];
    VPN = env->CP0_EntryHi & (TARGET_PAGE_MASK << 1);
#if defined(TARGET_MIPS64)
    VPN &= env->SEGMask;
#endif
    EHINV = (env->CP0_EntryHi & (1 << CP0EnHi_EHINV)) != 0;
    G = env->CP0_EntryLo0 & env->CP0_EntryLo1 & 1;
    V0 = (env->CP0_EntryLo0 & 2) != 0;
    D0 = (env->CP0_EntryLo0 & 4) != 0;
    XI0 = (env->CP0_EntryLo0 >> CP0EnLo_XI) &1;
    RI0 = (env->CP0_EntryLo0 >> CP0EnLo_RI) &1;
    V1 = (env->CP0_EntryLo1 & 2) != 0;
    D1 = (env->CP0_EntryLo1 & 4) != 0;
    XI1 = (env->CP0_EntryLo1 >> CP0EnLo_XI) &1;
    RI1 = (env->CP0_EntryLo1 >> CP0EnLo_RI) &1;

    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    /*
     * Discard cached TLB entries, unless tlbwi is just upgrading access
     * permissions on the current entry.
     */
    if (tlb->VPN != VPN || tlb_mmid != MMID || tlb->G != G ||
        (!tlb->EHINV && EHINV) ||
        (tlb->V0 && !V0) || (tlb->D0 && !D0) ||
        (!tlb->XI0 && XI0) || (!tlb->RI0 && RI0) ||
        (tlb->V1 && !V1) || (tlb->D1 && !D1) ||
        (!tlb->XI1 && XI1) || (!tlb->RI1 && RI1)) {
        r4k_mips_tlb_flush_extra(env, env->tlb->nb_tlb);
    }

    r4k_invalidate_tlb(env, idx, 0);
    r4k_fill_tlb(env, idx);
}